

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integerCoding.cpp
# Opt level: O2

size_t tinyusdz::Usd_IntegerCompression::CompressToBuffer
                 (uint32_t *ints,size_t numInts,char *compressed,string *err)

{
  uint32_t uVar1;
  uint32_t uVar2;
  __uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true> _Var3;
  mapped_type *pmVar4;
  size_t sVar5;
  byte bVar6;
  int iVar7;
  ulong uVar8;
  int *piVar9;
  int iVar10;
  ulong uVar11;
  byte bVar12;
  long lVar13;
  ulong uVar14;
  int iVar15;
  byte *pbVar16;
  long lVar17;
  bool bVar18;
  long lStack_a0;
  int local_8c;
  char *local_88;
  string *local_80;
  unique_ptr<char[],_std::default_delete<char[]>_> encodeBuffer;
  unordered_map<int,_unsigned_long,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
  counts;
  
  if (numInts == 0) {
    uVar14 = 0;
  }
  else {
    uVar14 = (numInts * 2 + 7 >> 3) + numInts * 4 + 4;
  }
  _Var3.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
  super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.super__Head_base<0UL,_char_*,_false>.
  _M_head_impl = (__uniq_ptr_impl<char,_std::default_delete<char[]>_>)operator_new__(uVar14);
  uVar14 = 0;
  encodeBuffer._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
  super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.super__Head_base<0UL,_char_*,_false>.
  _M_head_impl = (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)
                 (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)
                 _Var3.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                 super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                 super__Head_base<0UL,_char_*,_false>._M_head_impl;
  if (numInts != 0) {
    counts._M_h._M_buckets = &counts._M_h._M_single_bucket;
    counts._M_h._M_bucket_count = 1;
    counts._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    counts._M_h._M_element_count = 0;
    counts._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    counts._M_h._M_rehash_policy._M_next_resize = 0;
    counts._M_h._M_single_bucket = (__node_base_ptr)0x0;
    uVar11 = 0;
    iVar15 = 0;
    local_88 = compressed;
    local_80 = err;
    for (lVar13 = 0; numInts * 4 - lVar13 != 0; lVar13 = lVar13 + 4) {
      local_8c = *(int *)((long)ints + lVar13) - (int)uVar14;
      pmVar4 = std::__detail::
               _Map_base<int,_std::pair<const_int,_unsigned_long>,_std::allocator<std::pair<const_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<int,_std::pair<const_int,_unsigned_long>,_std::allocator<std::pair<const_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&counts,&local_8c);
      uVar8 = *pmVar4 + 1;
      *pmVar4 = uVar8;
      bVar18 = uVar8 == uVar11;
      iVar7 = local_8c;
      if (((uVar8 <= uVar11) && (uVar8 = uVar11, iVar7 = iVar15, bVar18)) && (iVar15 < local_8c)) {
        iVar7 = local_8c;
      }
      uVar14 = (ulong)*(uint *)((long)ints + lVar13);
      uVar11 = uVar8;
      iVar15 = iVar7;
    }
    std::
    _Hashtable<int,_std::pair<const_int,_unsigned_long>,_std::allocator<std::pair<const_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&counts._M_h);
    *(int *)_Var3.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
            super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
            super__Head_base<0UL,_char_*,_false>._M_head_impl = iVar15;
    pbVar16 = (byte *)((long)_Var3.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                             super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                             super__Head_base<0UL,_char_*,_false>._M_head_impl + 4);
    piVar9 = (int *)((long)_Var3.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                           super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                           super__Head_base<0UL,_char_*,_false>._M_head_impl +
                     (numInts * 2 + 7 >> 3) + 4);
    uVar2 = 0;
LAB_0010d1a8:
    switch(numInts) {
    case 0:
LAB_0010d39b:
      uVar14 = (long)piVar9 -
               (long)_Var3.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                     super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                     super__Head_base<0UL,_char_*,_false>._M_head_impl;
      err = local_80;
      compressed = local_88;
      break;
    case 1:
      iVar7 = *ints - uVar2;
      if (iVar7 == iVar15) {
        bVar12 = 0;
      }
      else if ((char)iVar7 == iVar7) {
        *(char *)piVar9 = (char)iVar7;
        piVar9 = (int *)((long)piVar9 + 1);
        bVar12 = 1;
      }
      else if ((short)iVar7 == iVar7) {
        *(short *)piVar9 = (short)iVar7;
        piVar9 = (int *)((long)piVar9 + 2);
        bVar12 = 2;
      }
      else {
        *piVar9 = iVar7;
        piVar9 = piVar9 + 1;
        bVar12 = 3;
      }
      goto LAB_0010d398;
    case 2:
      uVar1 = *ints;
      iVar7 = uVar1 - uVar2;
      if (iVar7 == iVar15) {
        bVar12 = 0;
      }
      else if ((char)iVar7 == iVar7) {
        *(char *)piVar9 = (char)iVar7;
        piVar9 = (int *)((long)piVar9 + 1);
        bVar12 = 1;
      }
      else if ((short)iVar7 == iVar7) {
        *(short *)piVar9 = (short)iVar7;
        piVar9 = (int *)((long)piVar9 + 2);
        bVar12 = 2;
      }
      else {
        *piVar9 = iVar7;
        piVar9 = piVar9 + 1;
        bVar12 = 3;
      }
      iVar7 = ints[1] - uVar1;
      if (iVar7 != iVar15) {
        if ((char)iVar7 == iVar7) {
          *(char *)piVar9 = (char)iVar7;
          bVar6 = 4;
          lStack_a0 = 1;
        }
        else if ((short)iVar7 == iVar7) {
          *(short *)piVar9 = (short)iVar7;
          bVar6 = 8;
          lStack_a0 = 2;
        }
        else {
          *piVar9 = iVar7;
          bVar6 = 0xc;
          lStack_a0 = 4;
        }
        piVar9 = (int *)((long)piVar9 + lStack_a0);
        bVar12 = bVar12 | bVar6;
      }
      goto LAB_0010d398;
    case 3:
      bVar12 = 0;
      for (lVar13 = 0; (int)lVar13 != 6; lVar13 = lVar13 + 2) {
        uVar1 = *(uint32_t *)((long)ints + lVar13 * 2);
        iVar7 = uVar1 - uVar2;
        if (iVar7 != iVar15) {
          bVar6 = (byte)lVar13;
          if ((char)iVar7 == iVar7) {
            bVar6 = (byte)(1 << (bVar6 & 0x1f));
            *(char *)piVar9 = (char)iVar7;
            lVar17 = 1;
          }
          else if ((short)iVar7 == iVar7) {
            bVar6 = (byte)(2 << (bVar6 & 0x1f));
            *(short *)piVar9 = (short)iVar7;
            lVar17 = 2;
          }
          else {
            bVar6 = (byte)(3 << (bVar6 & 0x1f));
            *piVar9 = iVar7;
            lVar17 = 4;
          }
          piVar9 = (int *)((long)piVar9 + lVar17);
          bVar12 = bVar12 | bVar6;
        }
        uVar2 = uVar1;
      }
LAB_0010d398:
      *pbVar16 = bVar12;
      goto LAB_0010d39b;
    default:
      goto switchD_0010d227_default;
    }
  }
  sVar5 = LZ4Compression::CompressToBuffer
                    ((char *)encodeBuffer._M_t.
                             super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                             super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                             super__Head_base<0UL,_char_*,_false>._M_head_impl,compressed,uVar14,err
                    );
  std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr(&encodeBuffer);
  return sVar5;
switchD_0010d227_default:
  bVar12 = 0;
  for (iVar7 = 0; iVar7 != 8; iVar7 = iVar7 + 2) {
    uVar1 = *ints;
    iVar10 = uVar1 - uVar2;
    if (iVar10 != iVar15) {
      bVar6 = (byte)iVar7;
      if ((char)iVar10 == iVar10) {
        bVar6 = (byte)(1 << (bVar6 & 0x1f));
        *(char *)piVar9 = (char)iVar10;
        lVar13 = 1;
      }
      else if ((short)iVar10 == iVar10) {
        bVar6 = (byte)(2 << (bVar6 & 0x1f));
        *(short *)piVar9 = (short)iVar10;
        lVar13 = 2;
      }
      else {
        bVar6 = (byte)(3 << (bVar6 & 0x1f));
        *piVar9 = iVar10;
        lVar13 = 4;
      }
      piVar9 = (int *)((long)piVar9 + lVar13);
      bVar12 = bVar12 | bVar6;
    }
    ints = ints + 1;
    uVar2 = uVar1;
  }
  *pbVar16 = bVar12;
  pbVar16 = pbVar16 + 1;
  numInts = numInts - 4;
  goto LAB_0010d1a8;
}

Assistant:

size_t
Usd_IntegerCompression::CompressToBuffer(
    uint32_t const *ints, size_t numInts, char *compressed, std::string *err)
{
    return _CompressIntegers(ints, numInts, compressed, err);
}